

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O1

void G_BuildTiccmd(ticcmd_t *cmd)

{
  byte *pbVar1;
  short *psVar2;
  double dVar3;
  int iVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined2 uVar8;
  BYTE BVar9;
  BYTE BVar10;
  BYTE BVar11;
  int iVar12;
  uint uVar13;
  ticcmd_t *ptVar14;
  int iVar15;
  byte bVar16;
  int iVar17;
  short sVar18;
  short sVar19;
  int iVar20;
  short sVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  float joyaxes [5];
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  double local_38;
  
  ptVar14 = I_BaseTiccmd();
  sVar21 = (ptVar14->ucmd).pitch;
  sVar19 = (ptVar14->ucmd).yaw;
  sVar18 = (ptVar14->ucmd).roll;
  sVar5 = (ptVar14->ucmd).forwardmove;
  sVar6 = (ptVar14->ucmd).sidemove;
  sVar7 = (ptVar14->ucmd).upmove;
  (cmd->ucmd).buttons = (ptVar14->ucmd).buttons;
  (cmd->ucmd).pitch = sVar21;
  (cmd->ucmd).yaw = sVar19;
  (cmd->ucmd).roll = sVar18;
  (cmd->ucmd).forwardmove = sVar5;
  (cmd->ucmd).sidemove = sVar6;
  (cmd->ucmd).upmove = sVar7;
  uVar8 = *(undefined2 *)&ptVar14->field_0x12;
  cmd->consistancy = ptVar14->consistancy;
  iVar20 = ticdup;
  *(undefined2 *)&cmd->field_0x12 = uVar8;
  cmd->consistancy = consistancy[consoleplayer][(maketic / ticdup) % 0x24];
  BVar11 = Button_Strafe.bDown;
  bVar16 = cl_run.Value ^ Button_Speed.bDown;
  iVar15 = 0;
  turnheld = iVar20 + turnheld;
  if (Button_Left.bDown == '\0' && Button_Right.bDown == '\0') {
    turnheld = 0;
  }
  if (Button_Strafe.bDown == '\0') {
    uVar13 = bVar16 + 2;
    if (5 < turnheld) {
      uVar13 = (uint)bVar16;
    }
    if (Button_Right.bDown != '\0') {
      G_AddViewAngle(angleturn[uVar13]);
      LocalKeyboardTurner = true;
    }
    if (Button_Left.bDown == '\0') {
      iVar15 = 0;
    }
    else {
      iVar15 = 0;
      G_AddViewAngle(-angleturn[uVar13]);
      LocalKeyboardTurner = true;
    }
  }
  else {
    if (Button_Right.bDown != '\0') {
      iVar15 = sidemove[bVar16];
    }
    if (Button_Left.bDown != '\0') {
      iVar15 = iVar15 - sidemove[bVar16];
    }
  }
  if (Button_LookUp.bDown != '\0') {
    G_AddViewPitch(lookspeed[bVar16]);
    LocalKeyboardTurner = true;
  }
  if (Button_LookDown.bDown != '\0') {
    G_AddViewPitch(-lookspeed[bVar16]);
    LocalKeyboardTurner = true;
  }
  if (Button_MoveUp.bDown == '\0') {
    sVar21 = 0;
  }
  else {
    sVar21 = (short)flyspeed[bVar16];
  }
  if (Button_MoveDown.bDown != '\0') {
    sVar21 = sVar21 - (short)flyspeed[bVar16];
  }
  if (Button_Klook.bDown == '\0') {
    if (Button_Forward.bDown == '\0') {
      iVar20 = 0;
    }
    else {
      iVar20 = forwardmove[bVar16];
    }
    if (Button_Back.bDown != '\0') {
      iVar20 = iVar20 - forwardmove[bVar16];
    }
  }
  else {
    if (Button_Forward.bDown != '\0') {
      G_AddViewPitch(lookspeed[bVar16]);
    }
    if (Button_Back.bDown == '\0') {
      iVar20 = 0;
    }
    else {
      iVar20 = 0;
      G_AddViewPitch(-lookspeed[bVar16]);
    }
  }
  BVar10 = Button_MoveLeft.bDown;
  BVar9 = Button_MoveRight.bDown;
  if (Button_MoveRight.bDown != '\0') {
    iVar15 = iVar15 + sidemove[bVar16];
  }
  if (Button_MoveLeft.bDown != '\0') {
    iVar15 = iVar15 - sidemove[bVar16];
  }
  if (Button_Attack.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 1;
  }
  if (Button_AltAttack.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x20;
  }
  if (Button_Use.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 2;
  }
  if (Button_Jump.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 4;
  }
  if (Button_Crouch.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 8;
  }
  if (Button_Zoom.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x80;
  }
  if (Button_Reload.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x40;
  }
  if (Button_User1.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if (Button_User2.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if (Button_User3.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if (Button_User4.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 3);
    *pbVar1 = *pbVar1 | 1;
  }
  if (Button_Speed.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  if (Button_Strafe.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  if (BVar9 != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  if (BVar10 != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  if (Button_LookDown.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 2;
  }
  if (Button_LookUp.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  if (Button_Back.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  if (Button_Forward.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if (Button_Right.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if (Button_Left.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if (Button_MoveDown.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 8;
  }
  if (Button_MoveUp.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 4;
  }
  if (Button_ShowScores.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x10;
  }
  I_GetAxes(&local_58);
  if ((Button_Strafe.bDown != '\0') || ((Button_Mlook.bDown != '\0' && (lookstrafe.Value == true))))
  {
    local_4c = local_58;
    local_58 = 0.0;
  }
  if (Button_Mlook.bDown != '\0') {
    local_54 = local_50;
    local_50 = 0.0;
  }
  if ((local_54 != 0.0) || (NAN(local_54))) {
    dVar3 = (double)(local_54 * 2048.0);
    if (0.0 <= local_54 * 2048.0) {
      dVar3 = ceil(dVar3);
      uVar22 = SUB84(dVar3,0);
      uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
    }
    else {
      dVar3 = floor(dVar3);
      uVar22 = SUB84(dVar3,0);
      uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
    }
    G_AddViewPitch((int)(double)CONCAT44(uVar24,uVar22));
    LocalKeyboardTurner = true;
  }
  if ((local_58 != 0.0) || (NAN(local_58))) {
    dVar3 = (double)(local_58 * -1280.0);
    if (0.0 <= local_58 * -1280.0) {
      dVar3 = ceil(dVar3);
      uVar22 = SUB84(dVar3,0);
      uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
    }
    else {
      dVar3 = floor(dVar3);
      uVar22 = SUB84(dVar3,0);
      uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
    }
    G_AddViewAngle((int)(double)CONCAT44(uVar24,uVar22));
    LocalKeyboardTurner = true;
  }
  dVar3 = (double)((float)sidemove[bVar16] * local_4c);
  if (0.0 <= (float)sidemove[bVar16] * local_4c) {
    dVar3 = ceil(dVar3);
    uVar22 = SUB84(dVar3,0);
    uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  else {
    dVar3 = floor(dVar3);
    uVar22 = SUB84(dVar3,0);
    uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  local_38 = (double)CONCAT44(uVar24,uVar22);
  dVar3 = (double)((float)forwardmove[bVar16] * local_50);
  if (0.0 <= (float)forwardmove[bVar16] * local_50) {
    dVar3 = ceil(dVar3);
    uVar22 = SUB84(dVar3,0);
    uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  else {
    dVar3 = floor(dVar3);
    uVar22 = SUB84(dVar3,0);
    uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  dVar3 = (double)(local_48 * 2048.0);
  if (0.0 <= local_48 * 2048.0) {
    dVar3 = ceil(dVar3);
    uVar23 = SUB84(dVar3,0);
    uVar25 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  else {
    dVar3 = floor(dVar3);
    uVar23 = SUB84(dVar3,0);
    uVar25 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  iVar20 = iVar20 + (int)(double)CONCAT44(uVar24,uVar22);
  if ((Button_Mlook.bDown == '\0') && (freelook.Value == false)) {
    iVar20 = iVar20 + (int)((float)mousey * m_forward.Value);
  }
  (cmd->ucmd).pitch = LocalViewPitch._2_2_;
  iVar12 = forwardmove[1];
  if (SendLand == true) {
    SendLand = false;
    sVar21 = -0x8000;
  }
  else {
    sVar21 = sVar21 + (short)(int)(double)CONCAT44(uVar25,uVar23);
  }
  iVar15 = iVar15 - (int)local_38;
  if ((BVar11 != '\0') || (lookstrafe.Value == true)) {
    iVar15 = iVar15 + (int)((float)mousex * m_side.Value);
  }
  iVar17 = -forwardmove[1];
  iVar4 = iVar17;
  if (iVar20 != iVar17 && SBORROW4(iVar20,iVar17) == iVar20 + forwardmove[1] < 0) {
    iVar4 = iVar20;
  }
  if (iVar15 != iVar17 && SBORROW4(iVar15,iVar17) == iVar15 + forwardmove[1] < 0) {
    iVar17 = iVar15;
  }
  mousey = 0;
  sVar18 = (short)forwardmove[1];
  sVar19 = (short)iVar4;
  if (forwardmove[1] < iVar20) {
    sVar19 = sVar18;
  }
  mousex = 0;
  psVar2 = &(cmd->ucmd).forwardmove;
  *psVar2 = *psVar2 + sVar19;
  sVar19 = (short)iVar17;
  if (iVar12 < iVar15) {
    sVar19 = sVar18;
  }
  psVar2 = &(cmd->ucmd).sidemove;
  *psVar2 = *psVar2 + sVar19;
  (cmd->ucmd).yaw = LocalViewAngle._2_2_;
  (cmd->ucmd).upmove = sVar21;
  LocalViewAngle = 0;
  LocalViewPitch = 0;
  if (sendturn180 == true) {
    sendturn180 = false;
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x10;
  }
  if (sendpause == true) {
    sendpause = false;
    Net_WriteByte('\x14');
  }
  if (sendsave == true) {
    sendsave = false;
    Net_WriteByte('\x15');
    Net_WriteString(savegamefile.Chars);
    Net_WriteString(savedescription);
    FString::operator=(&savegamefile,(char *)"");
  }
  if (SendItemUse != (AInventory *)0x0) {
    if (SendItemUse == (AInventory *)0x1) {
      Net_WriteByte('\x12');
    }
    else {
      Net_WriteByte('\x13');
      Net_WriteLong((SendItemUse->super_AActor).InventoryID);
    }
    SendItemUse = (AInventory *)0x0;
  }
  if (SendItemDrop != (AInventory *)0x0) {
    Net_WriteByte('\"');
    Net_WriteLong((SendItemDrop->super_AActor).InventoryID);
    SendItemDrop = (AInventory *)0x0;
  }
  psVar2 = &(cmd->ucmd).forwardmove;
  *psVar2 = *psVar2 << 8;
  psVar2 = &(cmd->ucmd).sidemove;
  *psVar2 = *psVar2 << 8;
  return;
}

Assistant:

void G_BuildTiccmd (ticcmd_t *cmd)
{
	int 		strafe;
	int 		speed;
	int 		forward;
	int 		side;
	int			fly;

	ticcmd_t	*base;

	base = I_BaseTiccmd (); 			// empty, or external driver
	*cmd = *base;

	cmd->consistancy = consistancy[consoleplayer][(maketic/ticdup)%BACKUPTICS];

	strafe = Button_Strafe.bDown;
	speed = Button_Speed.bDown ^ (int)cl_run;

	forward = side = fly = 0;

	// [RH] only use two stage accelerative turning on the keyboard
	//		and not the joystick, since we treat the joystick as
	//		the analog device it is.
	if (Button_Left.bDown || Button_Right.bDown)
		turnheld += ticdup;
	else
		turnheld = 0;

	// let movement keys cancel each other out
	if (strafe)
	{
		if (Button_Right.bDown)
			side += sidemove[speed];
		if (Button_Left.bDown)
			side -= sidemove[speed];
	}
	else
	{
		int tspeed = speed;

		if (turnheld < SLOWTURNTICS)
			tspeed += 2;		// slow turn
		
		if (Button_Right.bDown)
		{
			G_AddViewAngle (angleturn[tspeed]);
			LocalKeyboardTurner = true;
		}
		if (Button_Left.bDown)
		{
			G_AddViewAngle (-angleturn[tspeed]);
			LocalKeyboardTurner = true;
		}
	}

	if (Button_LookUp.bDown)
	{
		G_AddViewPitch (lookspeed[speed]);
		LocalKeyboardTurner = true;
	}
	if (Button_LookDown.bDown)
	{
		G_AddViewPitch (-lookspeed[speed]);
		LocalKeyboardTurner = true;
	}

	if (Button_MoveUp.bDown)
		fly += flyspeed[speed];
	if (Button_MoveDown.bDown)
		fly -= flyspeed[speed];

	if (Button_Klook.bDown)
	{
		if (Button_Forward.bDown)
			G_AddViewPitch (lookspeed[speed]);
		if (Button_Back.bDown)
			G_AddViewPitch (-lookspeed[speed]);
	}
	else
	{
		if (Button_Forward.bDown)
			forward += forwardmove[speed];
		if (Button_Back.bDown)
			forward -= forwardmove[speed];
	}

	if (Button_MoveRight.bDown)
		side += sidemove[speed];
	if (Button_MoveLeft.bDown)
		side -= sidemove[speed];

	// buttons
	if (Button_Attack.bDown)		cmd->ucmd.buttons |= BT_ATTACK;
	if (Button_AltAttack.bDown)		cmd->ucmd.buttons |= BT_ALTATTACK;
	if (Button_Use.bDown)			cmd->ucmd.buttons |= BT_USE;
	if (Button_Jump.bDown)			cmd->ucmd.buttons |= BT_JUMP;
	if (Button_Crouch.bDown)		cmd->ucmd.buttons |= BT_CROUCH;
	if (Button_Zoom.bDown)			cmd->ucmd.buttons |= BT_ZOOM;
	if (Button_Reload.bDown)		cmd->ucmd.buttons |= BT_RELOAD;

	if (Button_User1.bDown)			cmd->ucmd.buttons |= BT_USER1;
	if (Button_User2.bDown)			cmd->ucmd.buttons |= BT_USER2;
	if (Button_User3.bDown)			cmd->ucmd.buttons |= BT_USER3;
	if (Button_User4.bDown)			cmd->ucmd.buttons |= BT_USER4;

	if (Button_Speed.bDown)			cmd->ucmd.buttons |= BT_SPEED;
	if (Button_Strafe.bDown)		cmd->ucmd.buttons |= BT_STRAFE;
	if (Button_MoveRight.bDown)		cmd->ucmd.buttons |= BT_MOVERIGHT;
	if (Button_MoveLeft.bDown)		cmd->ucmd.buttons |= BT_MOVELEFT;
	if (Button_LookDown.bDown)		cmd->ucmd.buttons |= BT_LOOKDOWN;
	if (Button_LookUp.bDown)		cmd->ucmd.buttons |= BT_LOOKUP;
	if (Button_Back.bDown)			cmd->ucmd.buttons |= BT_BACK;
	if (Button_Forward.bDown)		cmd->ucmd.buttons |= BT_FORWARD;
	if (Button_Right.bDown)			cmd->ucmd.buttons |= BT_RIGHT;
	if (Button_Left.bDown)			cmd->ucmd.buttons |= BT_LEFT;
	if (Button_MoveDown.bDown)		cmd->ucmd.buttons |= BT_MOVEDOWN;
	if (Button_MoveUp.bDown)		cmd->ucmd.buttons |= BT_MOVEUP;
	if (Button_ShowScores.bDown)	cmd->ucmd.buttons |= BT_SHOWSCORES;

	// Handle joysticks/game controllers.
	float joyaxes[NUM_JOYAXIS];

	I_GetAxes(joyaxes);

	// Remap some axes depending on button state.
	if (Button_Strafe.bDown || (Button_Mlook.bDown && lookstrafe))
	{
		joyaxes[JOYAXIS_Side] = joyaxes[JOYAXIS_Yaw];
		joyaxes[JOYAXIS_Yaw] = 0;
	}
	if (Button_Mlook.bDown)
	{
		joyaxes[JOYAXIS_Pitch] = joyaxes[JOYAXIS_Forward];
		joyaxes[JOYAXIS_Forward] = 0;
	}

	if (joyaxes[JOYAXIS_Pitch] != 0)
	{
		G_AddViewPitch(joyint(joyaxes[JOYAXIS_Pitch] * 2048));
		LocalKeyboardTurner = true;
	}
	if (joyaxes[JOYAXIS_Yaw] != 0)
	{
		G_AddViewAngle(joyint(-1280 * joyaxes[JOYAXIS_Yaw]));
		LocalKeyboardTurner = true;
	}

	side -= joyint(sidemove[speed] * joyaxes[JOYAXIS_Side]);
	forward += joyint(joyaxes[JOYAXIS_Forward] * forwardmove[speed]);
	fly += joyint(joyaxes[JOYAXIS_Up] * 2048);

	// Handle mice.
	if (!Button_Mlook.bDown && !freelook)
	{
		forward += (int)((float)mousey * m_forward);
	}

	cmd->ucmd.pitch = LocalViewPitch >> 16;

	if (SendLand)
	{
		SendLand = false;
		fly = -32768;
	}

	if (strafe || lookstrafe)
		side += (int)((float)mousex * m_side);

	mousex = mousey = 0;

	// Build command.
	if (forward > MAXPLMOVE)
		forward = MAXPLMOVE;
	else if (forward < -MAXPLMOVE)
		forward = -MAXPLMOVE;
	if (side > MAXPLMOVE)
		side = MAXPLMOVE;
	else if (side < -MAXPLMOVE)
		side = -MAXPLMOVE;

	cmd->ucmd.forwardmove += forward;
	cmd->ucmd.sidemove += side;
	cmd->ucmd.yaw = LocalViewAngle >> 16;
	cmd->ucmd.upmove = fly;
	LocalViewAngle = 0;
	LocalViewPitch = 0;

	// special buttons
	if (sendturn180)
	{
		sendturn180 = false;
		cmd->ucmd.buttons |= BT_TURN180;
	}
	if (sendpause)
	{
		sendpause = false;
		Net_WriteByte (DEM_PAUSE);
	}
	if (sendsave)
	{
		sendsave = false;
		Net_WriteByte (DEM_SAVEGAME);
		Net_WriteString (savegamefile);
		Net_WriteString (savedescription);
		savegamefile = "";
	}
	if (SendItemUse == (const AInventory *)1)
	{
		Net_WriteByte (DEM_INVUSEALL);
		SendItemUse = NULL;
	}
	else if (SendItemUse != NULL)
	{
		Net_WriteByte (DEM_INVUSE);
		Net_WriteLong (SendItemUse->InventoryID);
		SendItemUse = NULL;
	}
	if (SendItemDrop != NULL)
	{
		Net_WriteByte (DEM_INVDROP);
		Net_WriteLong (SendItemDrop->InventoryID);
		SendItemDrop = NULL;
	}

	cmd->ucmd.forwardmove <<= 8;
	cmd->ucmd.sidemove <<= 8;
}